

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O0

MPP_RET avsd_reset_parameters(AvsdCtx_t *p_dec)

{
  avsd_frame_t *__s;
  AvsdFrame_t *frm;
  RK_U32 i;
  AvsdCtx_t *p_dec_local;
  
  set_frame_output(p_dec,p_dec->dpb[1]);
  set_frame_output(p_dec,p_dec->dpb[0]);
  set_frame_output(p_dec,p_dec->cur);
  set_frame_unref(p_dec,p_dec->dpb[1]);
  set_frame_unref(p_dec,p_dec->dpb[0]);
  set_frame_unref(p_dec,p_dec->cur);
  p_dec->cur = (AvsdFrame_t *)0x0;
  p_dec->dpb[0] = (AvsdFrame_t *)0x0;
  p_dec->dpb[1] = (AvsdFrame_t *)0x0;
  (p_dec->vsh).version_checked = '\0';
  for (frm._4_4_ = 0; frm._4_4_ < 3; frm._4_4_ = frm._4_4_ + 1) {
    __s = p_dec->mem->save + frm._4_4_;
    memset(__s,0,0x40);
    __s->idx = frm._4_4_;
    __s->slot_idx = -1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET avsd_reset_parameters(AvsdCtx_t *p_dec)
{
    RK_U32 i = 0;

    set_frame_output(p_dec, p_dec->dpb[1]);
    set_frame_output(p_dec, p_dec->dpb[0]);
    set_frame_output(p_dec, p_dec->cur);
    set_frame_unref(p_dec, p_dec->dpb[1]);
    set_frame_unref(p_dec, p_dec->dpb[0]);
    set_frame_unref(p_dec, p_dec->cur);

    p_dec->cur = NULL;
    p_dec->dpb[0] = NULL;
    p_dec->dpb[1] = NULL;

    p_dec->vsh.version_checked = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_dec->mem->save); i++) {
        AvsdFrame_t *frm = &p_dec->mem->save[i];

        memset(frm, 0, sizeof(*frm));
        frm->idx = i;
        frm->slot_idx = -1;
    }

    return MPP_OK;
}